

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeCase::testBufferUpload
          (MapBufferRangeCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          *result,int bufferSize)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint64 dVar4;
  deUint64 dVar5;
  void *dst;
  undefined8 *puVar6;
  Exception *this_00;
  TestError *this_01;
  long lVar7;
  string local_58;
  long local_38;
  long lVar3;
  
  if (3 < this->m_unmapFailures) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Unmapping failures exceeded limit","");
    tcu::TestError::TestError(this_01,&local_58);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = bufferSize + 3;
  if (-1 < bufferSize) {
    iVar2 = bufferSize;
  }
  local_38 = (long)(iVar2 >> 2);
  iVar2 = (*((this->
             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x40))
            (0x8892,(this->
                    super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                    ).
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                    .m_bufferID);
  iVar2 = bufferSize / 2;
  if (this->m_fullUpload != false) {
    iVar2 = bufferSize;
  }
  result->writtenSize = iVar2;
  if ((this->m_manualInvalidation == false) && (this->m_useUnusedUnspecifiedBuffer != true)) {
    if (this->m_useUnusedSpecifiedBuffer != true) {
      dVar5 = 0;
      goto LAB_007078b9;
    }
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x150))
              (0x8892,(long)bufferSize,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ).m_bufferUsage);
  }
  else {
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x150))
              (0x8892,(long)bufferSize,0,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ).m_bufferUsage);
  }
  dVar5 = deGetMicroseconds();
  dVar5 = dVar5 - dVar4;
LAB_007078b9:
  (result->duration).allocDuration = dVar5;
  dVar5 = deGetMicroseconds();
  lVar7 = local_38;
  if (this->m_fullUpload != false) {
    lVar7 = 0;
  }
  dst = (void *)(**(code **)(lVar3 + 0xd00))
                          (0x8892,lVar7,(long)result->writtenSize,this->m_mapFlags);
  dVar4 = deGetMicroseconds();
  if (dst != (void *)0x0) {
    (result->duration).mapDuration = dVar4 - dVar5;
    dVar5 = medianTimeMemcpy(dst,(this->
                                 super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                                 ).m_zeroData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,result->writtenSize);
    (result->duration).writeDuration = dVar5;
    dVar5 = deGetMicroseconds();
    cVar1 = (**(code **)(lVar3 + 0x1670))(0x8892);
    dVar4 = deGetMicroseconds();
    if (cVar1 == '\0') {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_00d164f8;
      __cxa_throw(puVar6,&(anonymous_namespace)::UnmapFailureError::typeinfo,
                  std::exception::~exception);
    }
    (result->duration).unmapDuration = dVar4 - dVar5;
    dVar5 = (dVar4 - dVar5) + (result->duration).mapDuration + (result->duration).writeDuration +
            (result->duration).allocDuration;
    (result->duration).totalDuration = dVar5;
    (result->duration).fitResponseDuration = dVar5;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"MapBufferRange returned NULL","");
  tcu::Exception::Exception(this_00,&local_58);
  __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MapBufferRangeCase::testBufferUpload (UploadSampleResult<MapBufferRangeDuration>& result, int bufferSize)
{
	const int unmapFailureThreshold = 4;

	for (; m_unmapFailures < unmapFailureThreshold; ++m_unmapFailures)
	{
		try
		{
			attemptBufferMap(result, bufferSize);
			return;
		}
		catch (UnmapFailureError&)
		{
		}
	}

	throw tcu::TestError("Unmapping failures exceeded limit");
}